

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::destruct_value
          (storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *this)

{
  std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ::~vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
             *)(this + 0x28));
  if (*(storage_t<tinyusdz::Animatable<tinyusdz::Token>_> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::Animatable<tinyusdz::Token>_> **)this,
                    *(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }